

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::_::Delimited<kj::ArrayPtr<kj::String>>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>
          (String *__return_storage_ptr__,_ *this,Delimited<kj::ArrayPtr<kj::String>_> *params,
          StringPtr *params_1,Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *params_2)

{
  size_t size;
  size_type extraout_RDX;
  char *target;
  initializer_list<unsigned_long> nums;
  size_t local_40;
  long local_38;
  size_t local_30;
  
  local_40 = Delimited<kj::ArrayPtr<kj::String>_>::size
                       ((Delimited<kj::ArrayPtr<kj::String>_> *)this);
  local_38 = (params->array).size_ - 1;
  local_30 = Delimited<kj::ArrayPtr<const_kj::StringPtr>_>::size
                       ((Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *)params_1);
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0x3;
  size = sum((_ *)&local_40,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<kj::String>,kj::StringPtr&,kj::_::Delimited<kj::ArrayPtr<kj::StringPtr_const>>>
            (target,(Delimited<kj::ArrayPtr<kj::String>_> *)this,(StringPtr *)params,
             (Delimited<kj::ArrayPtr<const_kj::StringPtr>_> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}